

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O3

ArrayBufferContentForDelayedFreeBase * __thiscall
Js::ProjectionArrayBuffer::CopyBufferContentForDelayedFree
          (ProjectionArrayBuffer *this,RefCountedBuffer *content,uint32 bufferLength)

{
  HeapAllocator *alloc;
  ArrayBufferContentForDelayedFreeBase *pAVar1;
  Recycler *pRVar2;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&ArrayBufferContentForDelayedFree<void(*)(void*)>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_5dae254;
  data.filename._0_4_ = 0x4d8;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
  pAVar1 = (ArrayBufferContentForDelayedFreeBase *)new<Memory::HeapAllocator>(0x30,alloc,0x2ff150);
  pRVar2 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  pAVar1->buffer = content;
  pAVar1->bufferLength = bufferLength;
  pAVar1->recycler = pRVar2;
  pAVar1->markBit = false;
  pAVar1->_vptr_ArrayBufferContentForDelayedFreeBase =
       (_func_int **)&PTR__ArrayBufferContentForDelayedFreeBase_014f15f0;
  pAVar1[1]._vptr_ArrayBufferContentForDelayedFreeBase = (_func_int **)CoTaskMemFree;
  return pAVar1;
}

Assistant:

ArrayBufferContentForDelayedFreeBase* ProjectionArrayBuffer::CopyBufferContentForDelayedFree(RefCountedBuffer * content, DECLSPEC_GUARD_OVERFLOW uint32 bufferLength)
    {
        // This heap object will be deleted when the Recycler::DelayedFreeArrayBuffer determines to remove this item
        return HeapNew(ArrayBufferContentForDelayedFree<FreeFn>, content, bufferLength, GetRecycler(), CoTaskMemFree);
    }